

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Serializer::AddVariableInt(Serializer *this,uint64_t value)

{
  unsigned_short uVar1;
  uint uVar2;
  uchar *puVar3;
  uint64_t v64;
  uint32_t v32;
  uint16_t v16;
  uint8_t *buf;
  uint64_t value_local;
  Serializer *this_local;
  
  CheckNeedSize(this,9);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
  puVar3 = puVar3 + this->offset_;
  if (value < 0xfd) {
    *puVar3 = (uchar)value;
    this->offset_ = this->offset_ + 1;
  }
  else {
    uVar1 = ::std::numeric_limits<unsigned_short>::max();
    if (uVar1 < value) {
      uVar2 = ::std::numeric_limits<unsigned_int>::max();
      if (uVar2 < value) {
        *puVar3 = 0xff;
        *(uint64_t *)(puVar3 + 1) = value;
        this->offset_ = this->offset_ + 9;
      }
      else {
        *puVar3 = 0xfe;
        *(int *)(puVar3 + 1) = (int)value;
        this->offset_ = this->offset_ + 5;
      }
    }
    else {
      *puVar3 = 0xfd;
      *(short *)(puVar3 + 1) = (short)value;
      this->offset_ = this->offset_ + 3;
    }
  }
  return;
}

Assistant:

void Serializer::AddVariableInt(uint64_t value) {
  // TODO(k-matsuzawa) need endian support.
  CheckNeedSize(9);
  uint8_t* buf = &buffer_.data()[offset_];
  if (value <= kViMax8) {
    *buf = static_cast<uint8_t>(value);
    ++offset_;
  } else if (value <= std::numeric_limits<uint16_t>::max()) {
    *buf = kViTag16;
    ++buf;
    uint16_t v16 = static_cast<uint16_t>(value);
    memcpy(buf, &v16, sizeof(v16));
    offset_ += sizeof(v16) + 1;
  } else if (value <= std::numeric_limits<uint32_t>::max()) {
    *buf = kViTag32;
    ++buf;
    uint32_t v32 = static_cast<uint32_t>(value);
    memcpy(buf, &v32, sizeof(v32));
    offset_ += sizeof(v32) + 1;
  } else {
    *buf = kViTag64;
    ++buf;
    uint64_t v64 = value;
    memcpy(buf, &v64, sizeof(v64));
    offset_ += sizeof(v64) + 1;
  }
}